

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

void __thiscall
Wasm::WasmBytecodeGenerator::SetUnreachableState(WasmBytecodeGenerator *this,bool isUnreachable)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  EmitInfo *pEVar4;
  IWasmByteCodeWriter *local_40;
  WasmType local_2c;
  EmitInfo local_28;
  EmitInfo local_20;
  EmitInfo info;
  uint32 popped;
  bool isUnreachable_local;
  WasmBytecodeGenerator *this_local;
  
  if (isUnreachable) {
    local_40 = this->m_emptyWriter;
  }
  else {
    local_40 = this->m_originalWriter;
  }
  this->m_writer = local_40;
  info.type._3_1_ = isUnreachable;
  if (isUnreachable) {
    bVar2 = JsUtil::Stack<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_DefaultComparer>::Empty
                      (&this->m_evalStack);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                         ,0x85a,"(!m_evalStack.Empty())","!m_evalStack.Empty()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    info.super_EmitInfoBase.location = 0;
    while (pEVar4 = JsUtil::Stack<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_DefaultComparer>::
                    Top(&this->m_evalStack), pEVar4->type != Limit) {
      local_20 = JsUtil::Stack<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_DefaultComparer>::Pop
                           (&this->m_evalStack);
      ReleaseLocation(this,&local_20);
      info.super_EmitInfoBase.location = info.super_EmitInfoBase.location + 1;
    }
    while (info.super_EmitInfoBase.location != 0) {
      local_2c = Any;
      info.super_EmitInfoBase.location = info.super_EmitInfoBase.location - 1;
      EmitInfo::EmitInfo(&local_28,&local_2c);
      JsUtil::Stack<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_DefaultComparer>::Push
                (&this->m_evalStack,&local_28);
    }
  }
  this->isUnreachable = (bool)(info.type._3_1_ & 1);
  return;
}

Assistant:

void WasmBytecodeGenerator::SetUnreachableState(bool isUnreachable)
{
    m_writer = isUnreachable ? m_emptyWriter : m_originalWriter;
    if (isUnreachable)
    {
        // Replace the current stack with the any type
        Assert(!m_evalStack.Empty());
        uint32 popped = 0;
        while (m_evalStack.Top().type != WasmTypes::Limit)
        {
            EmitInfo info = m_evalStack.Pop();
            ReleaseLocation(&info);
            ++popped;
        }
        while (popped-- > 0)
        {
            m_evalStack.Push(EmitInfo(WasmTypes::Any));
        }
    }
    this->isUnreachable = isUnreachable;
}